

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

bool __thiscall ClipperLib::Clipper::IsTopHorz(Clipper *this,long64 XPos)

{
  longlong *plVar1;
  TEdge *local_28;
  TEdge *e;
  long64 XPos_local;
  Clipper *this_local;
  
  local_28 = this->m_SortedEdges;
  while( true ) {
    if (local_28 == (TEdge *)0x0) {
      return true;
    }
    plVar1 = std::min<long_long>(&local_28->xcurr,&local_28->xtop);
    if ((*plVar1 <= XPos) &&
       (plVar1 = std::max<long_long>(&local_28->xcurr,&local_28->xtop), XPos <= *plVar1)) break;
    local_28 = local_28->nextInSEL;
  }
  return false;
}

Assistant:

bool Clipper::IsTopHorz(const long64 XPos)
{
  TEdge* e = m_SortedEdges;
  while( e )
  {
    if(  ( XPos >= std::min(e->xcurr, e->xtop) ) &&
      ( XPos <= std::max(e->xcurr, e->xtop) ) ) return false;
    e = e->nextInSEL;
  }
  return true;
}